

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult *
Catch::clara::detail::convertInto<unsigned_int>
          (ParserResult *__return_storage_ptr__,string *source,uint *target)

{
  long *plVar1;
  size_type *psVar2;
  stringstream ss;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  long local_1a0 [2];
  ostream local_190 [16];
  byte abStack_180 [96];
  ios_base local_120 [264];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(source->_M_dataplus)._M_p,source->_M_string_length);
  ::std::istream::_M_extract<unsigned_int>((uint *)local_1a0);
  if ((abStack_180[*(long *)(local_1a0[0] + -0x18)] & 5) == 0) {
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b4328;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    ::std::operator+(&local_1c0,"Unable to convert \'",source);
    plVar1 = (long *)::std::__cxx11::string::append((char *)&local_1c0);
    psVar2 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_1e0.field_2._M_allocated_capacity = *psVar2;
      local_1e0.field_2._8_8_ = plVar1[3];
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    }
    else {
      local_1e0.field_2._M_allocated_capacity = *psVar2;
      local_1e0._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_1e0._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
              (__return_storage_ptr__,RuntimeError,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

inline auto convertInto( std::string const &source, T& target ) -> ParserResult {
        std::stringstream ss;
        ss << source;
        ss >> target;
        if( ss.fail() )
            return ParserResult::runtimeError( "Unable to convert '" + source + "' to destination type" );
        else
            return ParserResult::ok( ParseResultType::Matched );
    }